

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O0

void __thiscall
pstore::error_or<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>::~error_or
          (error_or<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_> *this)

{
  storage_type *this_00;
  error_or<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_> *this_local;
  
  if ((this->has_error_ & 1U) == 0) {
    this_00 = get_storage(this);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(this_00);
  }
  else {
    get_error_storage(this);
  }
  return;
}

Assistant:

error_or<T>::~error_or () {
        if (!has_error_) {
            get_storage ()->~storage_type ();
        } else {
            using error_code = std::error_code;
            get_error_storage ()->~error_code ();
        }
    }